

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O0

ares_status_t
ares_hosts_search_host
          (ares_channel_t *channel,ares_bool_t use_env,char *host,ares_hosts_entry_t **entry)

{
  ares_hosts_entry_t *paVar1;
  ares_status_t status;
  ares_hosts_entry_t **entry_local;
  char *host_local;
  ares_bool_t use_env_local;
  ares_channel_t *channel_local;
  
  *entry = (ares_hosts_entry_t *)0x0;
  channel_local._4_4_ = ares_hosts_update(channel,use_env);
  if (channel_local._4_4_ == ARES_SUCCESS) {
    if (channel->hf == (ares_hosts_file_t *)0x0) {
      channel_local._4_4_ = ARES_ENOTFOUND;
    }
    else {
      paVar1 = (ares_hosts_entry_t *)ares_htable_strvp_get_direct(channel->hf->hosthash,host);
      *entry = paVar1;
      if (*entry == (ares_hosts_entry_t *)0x0) {
        channel_local._4_4_ = ARES_ENOTFOUND;
      }
      else {
        channel_local._4_4_ = ARES_SUCCESS;
      }
    }
  }
  return channel_local._4_4_;
}

Assistant:

ares_status_t ares_hosts_search_host(ares_channel_t *channel,
                                     ares_bool_t use_env, const char *host,
                                     const ares_hosts_entry_t **entry)
{
  ares_status_t status;

  *entry = NULL;

  status = ares_hosts_update(channel, use_env);
  if (status != ARES_SUCCESS) {
    return status;
  }

  if (channel->hf == NULL) {
    return ARES_ENOTFOUND; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  *entry = ares_htable_strvp_get_direct(channel->hf->hosthash, host);
  if (*entry == NULL) {
    return ARES_ENOTFOUND;
  }

  return ARES_SUCCESS;
}